

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O2

void __thiscall
phyr::Timer::TimerLoop<phyr::ProgressReporter::RefreshFunctor>::operator()
          (TimerLoop<phyr::ProgressReporter::RefreshFunctor> *this,
          unique_ptr<phyr::ProgressReporter::RefreshFunctor,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
          *f,int delay)

{
  bool bVar1;
  rep in_RAX;
  uint64_t uVar2;
  uint64_t uVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_38.__r = in_RAX;
  uVar2 = getElapsedTime(this->timer);
  while( true ) {
    bVar1 = isActive(this->timer);
    if (!bVar1) break;
    uVar3 = getElapsedTime(this->timer);
    if ((ulong)(long)delay <= uVar3 - uVar2) {
      ProgressReporter::RefreshFunctor::operator()
                ((f->_M_t).
                 super___uniq_ptr_impl<phyr::ProgressReporter::RefreshFunctor,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_phyr::ProgressReporter::RefreshFunctor_*,_std::default_delete<phyr::ProgressReporter::RefreshFunctor>_>
                 .super__Head_base<0UL,_phyr::ProgressReporter::RefreshFunctor_*,_false>.
                 _M_head_impl);
      uVar2 = uVar3;
    }
    local_38.__r = 0x14;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
  }
  return;
}

Assistant:

void operator()(std::unique_ptr<Functor> f, int delay, Args... args) {
            uint64_t elapsed, delta;
            uint64_t last_call_tstamp = timer->getElapsedTime();

            while (timer->isActive()) {
                elapsed = timer->getElapsedTime();
                delta = elapsed - last_call_tstamp;

                // Check if elapsed time is more than provided delay
                if (delta >= delay) {
                    // Reset {last_call_tstamp}
                    last_call_tstamp = elapsed;
                    // Call the provided functor
                    (*f)(args...);
                }

                // Sleep to allow for context switches
                std::this_thread::sleep_for(std::chrono::milliseconds(20));
            }
        }